

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O1

void Diligent::LinuxDebug::AssertionFailed(Char *Message,char *Function,char *File,int Line)

{
  bool bVar1;
  int in_R9D;
  String AssertionFailedMessage;
  String local_28;
  
  BasicPlatformDebug::FormatAssertionFailedMessage_abi_cxx11_
            (&local_28,(BasicPlatformDebug *)Message,Function,File,(char *)(ulong)(uint)Line,in_R9D)
  ;
  if (DebugMessageCallback == (undefined *)0x0) {
    OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR,local_28._M_dataplus._M_p,(char *)0x0,
                       (char *)0x0,0,Auto);
  }
  else {
    (*(code *)DebugMessageCallback)(2,local_28._M_dataplus._M_p,0,0,0);
  }
  bVar1 = BasicPlatformDebug::GetBreakOnError();
  if (bVar1) {
    raise(5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LinuxDebug::AssertionFailed(const Char* Message, const char* Function, const char* File, int Line)
{
    String AssertionFailedMessage = FormatAssertionFailedMessage(Message, Function, File, Line);
    if (DebugMessageCallback)
    {
        DebugMessageCallback(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }
    else
    {
        OutputDebugMessage(DEBUG_MESSAGE_SEVERITY_ERROR, AssertionFailedMessage.c_str(), nullptr, nullptr, 0);
    }

    if (GetBreakOnError())
    {
        raise(SIGTRAP);
    }
}